

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O1

void emit_eobrun(phuff_entropy_ptr entropy)

{
  uint uVar1;
  j_compress_ptr pjVar2;
  jpeg_error_mgr *pjVar3;
  char *pcVar4;
  int size;
  long lVar5;
  
  if ((long)(int)entropy->EOBRUN != 0) {
    size = ""[(int)entropy->EOBRUN] - 1;
    if (0xf < ""[(int)entropy->EOBRUN]) {
      pjVar2 = entropy->cinfo;
      pjVar3 = pjVar2->err;
      pjVar3->msg_code = 0x28;
      (*pjVar3->error_exit)((j_common_ptr)pjVar2);
    }
    emit_symbol(entropy,entropy->ac_tbl_no,size * 0x10);
    if (size != 0) {
      emit_bits(entropy,entropy->EOBRUN,size);
    }
    entropy->EOBRUN = 0;
    uVar1 = entropy->BE;
    if ((uVar1 != 0) && (entropy->gather_statistics == 0)) {
      pcVar4 = entropy->bit_buffer;
      lVar5 = 0;
      do {
        emit_bits(entropy,(int)pcVar4[lVar5],1);
        lVar5 = lVar5 + 1;
      } while (uVar1 != (uint)lVar5);
    }
    entropy->BE = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_eobrun(phuff_entropy_ptr entropy)
{
  register int temp, nbits;

  if (entropy->EOBRUN > 0) {    /* if there is any pending EOBRUN */
    temp = entropy->EOBRUN;
    nbits = JPEG_NBITS_NONZERO(temp) - 1;
    /* safety check: shouldn't happen given limited correction-bit buffer */
    if (nbits > 14)
      ERREXIT(entropy->cinfo, JERR_HUFF_MISSING_CODE);

    emit_symbol(entropy, entropy->ac_tbl_no, nbits << 4);
    if (nbits)
      emit_bits(entropy, entropy->EOBRUN, nbits);

    entropy->EOBRUN = 0;

    /* Emit any buffered correction bits */
    emit_buffered_bits(entropy, entropy->bit_buffer, entropy->BE);
    entropy->BE = 0;
  }
}